

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

void target_set_location(wchar_t y,wchar_t x)

{
  _Bool _Var1;
  loc grid;
  
  grid = (loc)loc(x,y);
  _Var1 = square_in_bounds_fully(cave,grid);
  target.grid = (loc_conflict)grid;
  if (!_Var1) {
    target.grid.x = 0;
    target.grid.y = 0;
  }
  target.midx = 0;
  target_set = _Var1;
  return;
}

Assistant:

void target_set_location(int y, int x)
{
	struct loc grid = loc(x, y);

	/* Legal target */
	if (square_in_bounds_fully(cave, grid)) {
		/* Save target info */
		target_set = true;
		target.midx = 0;
		target.grid = grid;
		return;
	}

	/* Reset target info */
	target_set = false;
	target.midx = 0;
	target.grid.y = 0;
	target.grid.x = 0;
}